

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

void nvlist_free_type(nvlist_t *nvl,char *name,int type)

{
  nvpair_t *nvp_00;
  nvpair_t *nvp;
  int type_local;
  char *name_local;
  nvlist_t *nvl_local;
  
  if (nvl == (nvlist_t *)0x0) {
    __assert_fail("(nvl) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x16d,"void nvlist_free_type(nvlist_t *, const char *, int)");
  }
  if (nvl->nvl_magic != 0x6e766c) {
    __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x16d,"void nvlist_free_type(nvlist_t *, const char *, int)");
  }
  if (nvl->nvl_error != 0) {
    __assert_fail("nvl->nvl_error == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x16e,"void nvlist_free_type(nvlist_t *, const char *, int)");
  }
  if ((type != 0) && ((type < 1 || (0xc < type)))) {
    __assert_fail("type == 0 || (type >= 1 && type <= 12)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x170,"void nvlist_free_type(nvlist_t *, const char *, int)");
  }
  nvp_00 = nvlist_find(nvl,type,name);
  if (nvp_00 == (nvpair_t *)0x0) {
    nvlist_report_missing(type,name);
  }
  else {
    nvlist_free_nvpair(nvl,nvp_00);
  }
  return;
}

Assistant:

void
nvlist_free_type(nvlist_t *nvl, const char *name, int type)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);
	PJDLOG_ASSERT(nvl->nvl_error == 0);
	PJDLOG_ASSERT(type == NV_TYPE_NONE ||
	    (type >= NV_TYPE_FIRST && type <= NV_TYPE_LAST));

	nvp = nvlist_find(nvl, type, name);
	if (nvp != NULL)
		nvlist_free_nvpair(nvl, nvp);
	else
		nvlist_report_missing(type, name);
}